

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_merge_util.cpp
# Opt level: O1

bool spvtools::opt::blockmergeutil::CanMergeWithSuccessor(IRContext *context,BasicBlock *block)

{
  StructuredCFGAnalysis *this;
  Function *pFVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar9;
  Instruction *pIVar10;
  Instruction *pIVar11;
  BasicBlock *pBVar12;
  uint uVar13;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> UVar14;
  
  pIVar10 = (block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
  if (pIVar10->opcode_ != OpBranch) {
    return false;
  }
  uVar6 = (pIVar10->has_result_id_ & 1) + 1;
  if (pIVar10->has_type_id_ == false) {
    uVar6 = (uint)pIVar10->has_result_id_;
  }
  uVar6 = Instruction::GetSingleWordOperand(pIVar10,uVar6);
  if ((context->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(context);
  }
  pvVar9 = CFG::preds((context->cfg_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                      .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,uVar6);
  uVar7 = 0;
  if ((long)(pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start != 4) {
    return false;
  }
  pIVar10 = (block->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar10->has_result_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
  }
  bVar3 = anon_unknown_0::IsMerge(context,uVar7);
  bVar4 = anon_unknown_0::IsMerge(context,uVar6);
  if ((bVar3) && (bVar4)) {
    return false;
  }
  if (bVar4) {
    if ((context->feature_mgr_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
        .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl ==
        (FeatureManager *)0x0) {
      IRContext::AnalyzeFeatures(context);
    }
    bVar5 = EnumSet<spvtools::Extension>::contains
                      (&((context->feature_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                         .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl
                        )->extensions_,kSPV_KHR_maximal_reconvergence);
    if (bVar5) {
      return false;
    }
  }
  if ((bVar3) && (bVar3 = anon_unknown_0::IsContinue(context,uVar6), bVar3)) {
    return false;
  }
  pIVar10 = BasicBlock::GetMergeInst(block);
  pIVar11 = BasicBlock::GetMergeInst(block);
  if (pIVar11 != (Instruction *)0x0) {
    uVar7 = (pIVar10->has_result_id_ & 1) + 1;
    if (pIVar10->has_type_id_ == false) {
      uVar7 = (uint)pIVar10->has_result_id_;
    }
    uVar7 = Instruction::GetSingleWordOperand(pIVar10,uVar7);
    if (uVar6 != uVar7) {
      bVar3 = anon_unknown_0::IsHeader(context,uVar6);
      if (bVar3) {
        return false;
      }
      pBVar12 = IRContext::get_instr_block(context,uVar6);
      pIVar11 = BasicBlock::terminator(pBVar12);
      if (pIVar10->opcode_ != OpLoopMerge) {
        __assert_fail("merge_inst->opcode() == spv::Op::OpLoopMerge",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/block_merge_util.cpp"
                      ,0x86,
                      "bool spvtools::opt::blockmergeutil::CanMergeWithSuccessor(IRContext *, BasicBlock *)"
                     );
      }
      if (1 < pIVar11->opcode_ - OpBranch) {
        return false;
      }
    }
  }
  if ((!bVar4) && (bVar3 = anon_unknown_0::IsContinue(context,uVar6), !bVar3)) {
    return true;
  }
  if ((context->valid_analyses_ & kAnalysisStructuredCFG) == kAnalysisNone) {
    IRContext::BuildStructuredCFGAnalysis(context);
  }
  this = (context->struct_cfg_analysis_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::StructuredCFGAnalysis,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
         .super__Head_base<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_false>._M_head_impl;
  pIVar10 = (block->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar6 = 0;
  if (pIVar10->has_result_id_ == true) {
    uVar6 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
  }
  uVar6 = StructuredCFGAnalysis::ContainingSwitch(this,uVar6);
  if (uVar6 != 0) {
    uVar7 = StructuredCFGAnalysis::SwitchMergeBlock(this,uVar6);
    pFVar1 = block->function_;
    UVar14 = std::
             __find_if<spvtools::opt::UptrVectorIterator<spvtools::opt::BasicBlock,false>,__gnu_cxx::__ops::_Iter_pred<spvtools::opt::Function::FindBlock(unsigned_int)::_lambda(spvtools::opt::BasicBlock_const&)_1_>>
                       (&pFVar1->blocks_,
                        (pFVar1->blocks_).
                        super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,&pFVar1->blocks_,
                        (pFVar1->blocks_).
                        super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,uVar6);
    pBVar12 = ((UVar14.iterator_._M_current._M_current)->_M_t).
              super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
              .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    pIVar10 = *(Instruction **)
               ((long)&(pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
    if ((pIVar10 == (Instruction *)0x0) ||
       ((pIVar10->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
      __assert_fail("!insts_.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h"
                    ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
    }
    pIVar10 = *(Instruction **)
               ((long)&(pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x18);
    uVar2 = (pIVar10->has_result_id_ & 1) + 1;
    if (pIVar10->has_type_id_ == false) {
      uVar2 = (uint)pIVar10->has_result_id_;
    }
    bVar3 = 1 < (int)((ulong)((long)(pIVar10->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pIVar10->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
                uVar2;
    if (bVar3) {
      uVar13 = 1;
      do {
        uVar6 = Instruction::GetSingleWordOperand(pIVar10,uVar2 + uVar13);
        pIVar11 = (block->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        uVar8 = 0;
        if (pIVar11->has_result_id_ == true) {
          uVar8 = Instruction::GetSingleWordOperand(pIVar11,(uint)pIVar11->has_type_id_);
        }
        if ((uVar6 != uVar7) && (uVar6 == uVar8)) {
          bVar4 = true;
          goto LAB_005340e3;
        }
        uVar13 = uVar13 + 2;
        uVar2 = (pIVar10->has_result_id_ & 1) + 1;
        if (pIVar10->has_type_id_ == false) {
          uVar2 = (uint)pIVar10->has_result_id_;
        }
        bVar3 = uVar13 < (int)((ulong)((long)(pIVar10->operands_).
                                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(pIVar10->operands_).
                                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                         -0x55555555 - uVar2;
      } while (bVar3);
    }
    bVar4 = false;
LAB_005340e3:
    if (bVar3) goto LAB_005340eb;
  }
  bVar4 = false;
LAB_005340eb:
  if (bVar4) {
    return false;
  }
  return true;
}

Assistant:

bool CanMergeWithSuccessor(IRContext* context, BasicBlock* block) {
  // Find block with single successor which has no other predecessors.
  auto ii = block->end();
  --ii;
  Instruction* br = &*ii;
  if (br->opcode() != spv::Op::OpBranch) {
    return false;
  }

  const uint32_t lab_id = br->GetSingleWordInOperand(0);
  if (context->cfg()->preds(lab_id).size() != 1) {
    return false;
  }

  bool pred_is_merge = IsMerge(context, block);
  bool succ_is_merge = IsMerge(context, lab_id);
  if (pred_is_merge && succ_is_merge) {
    // Cannot merge two merges together.
    return false;
  }

  // Note: This means that the instructions in a break block will execute as if
  // they were still diverged according to the loop iteration. This restricts
  // potential transformations an implementation may perform on the IR to match
  // shader author expectations. Similarly, instructions in the loop construct
  // cannot be moved into the continue construct unless it can be proven that
  // invocations are always converged.
  if (succ_is_merge && context->get_feature_mgr()->HasExtension(
                           kSPV_KHR_maximal_reconvergence)) {
    return false;
  }

  if (pred_is_merge && IsContinue(context, lab_id)) {
    // Cannot merge a continue target with a merge block.
    return false;
  }

  Instruction* merge_inst = block->GetMergeInst();
  const bool pred_is_header = IsHeader(block);
  if (pred_is_header && lab_id != merge_inst->GetSingleWordInOperand(0u)) {
    bool succ_is_header = IsHeader(context, lab_id);
    if (pred_is_header && succ_is_header) {
      // Cannot merge two headers together when the successor is not the merge
      // block of the predecessor.
      return false;
    }

    // If this is a header block and the successor is not its merge, we must
    // be careful about which blocks we are willing to merge together.
    // OpLoopMerge must be followed by a conditional or unconditional branch.
    // The merge must be a loop merge because a selection merge cannot be
    // followed by an unconditional branch.
    BasicBlock* succ_block = context->get_instr_block(lab_id);
    spv::Op succ_term_op = succ_block->terminator()->opcode();
    assert(merge_inst->opcode() == spv::Op::OpLoopMerge);
    if (succ_term_op != spv::Op::OpBranch &&
        succ_term_op != spv::Op::OpBranchConditional) {
      return false;
    }
  }

  if (succ_is_merge || IsContinue(context, lab_id)) {
    auto* struct_cfg = context->GetStructuredCFGAnalysis();
    auto switch_block_id = struct_cfg->ContainingSwitch(block->id());
    if (switch_block_id) {
      auto switch_merge_id = struct_cfg->SwitchMergeBlock(switch_block_id);
      const auto* switch_inst =
          &*block->GetParent()->FindBlock(switch_block_id)->tail();
      for (uint32_t i = 1; i < switch_inst->NumInOperands(); i += 2) {
        auto target_id = switch_inst->GetSingleWordInOperand(i);
        if (target_id == block->id() && target_id != switch_merge_id) {
          // Case constructs must be structurally dominated by the OpSwitch.
          // Since the successor is the merge/continue for another construct,
          // merging the blocks would break that requirement.
          return false;
        }
      }
    }
  }

  return true;
}